

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

int Cba_FonLeft(Cba_Ntk_t *p,int f)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  
  if (f < 1) {
    __assert_fail("Cba_FonIsReal(f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                  ,0x113,"int Cba_FonRange(Cba_Ntk_t *, int)");
  }
  if (0 < (p->vFonRange).nSize) {
    Vec_IntFillExtra(&p->vFonRange,f + 1,0);
    if ((p->vFonRange).nSize <= f) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar2 = (p->vFonRange).pArray[(uint)f];
    if ((int)uVar2 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (1 < uVar2) {
      pVVar1 = p->pDesign->vHash->vObjs;
      uVar2 = uVar2 * 2 & 0x7ffffffc;
      if ((int)uVar2 < pVVar1->nSize) {
        return pVVar1->pArray[uVar2];
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
  }
  return 0;
}

Assistant:

static inline int            Cba_FonLeft( Cba_Ntk_t * p, int f )             { return Cba_NtkRangeLeft(p, Cba_FonRange(p, f));                                             }